

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::base_internal::(anonymous_namespace)::StrErrorInternal_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int errnum)

{
  char *__s;
  size_t sVar1;
  char buf [100];
  char acStack_88 [104];
  
  __s = strerror_r((int)this,acStack_88,100);
  if (*__s == '\0') {
    snprintf(acStack_88,100,"Unknown error %d",(ulong)this & 0xffffffff);
    __s = acStack_88;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StrErrorInternal(int errnum) {
  char buf[100];
  const char* str = StrErrorAdaptor(errnum, buf, sizeof buf);
  if (*str == '\0') {
    snprintf(buf, sizeof buf, "Unknown error %d", errnum);
    str = buf;
  }
  return str;
}